

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O3

ConfidentialTransactionController *
cfd::api::TransactionApiBase::AddSign<cfd::ConfidentialTransactionController>
          (ConfidentialTransactionController *__return_storage_ptr__,
          function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *create_controller,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  pointer pSVar1;
  bool bVar2;
  CfdException *this;
  byte bVar3;
  ScriptElement *pSVar4;
  ScriptElement *element;
  pointer pSVar5;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> sign_stack;
  ScriptBuilder builder;
  ScriptOperator op_code;
  Script script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_228;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *local_208;
  Script local_200;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [32];
  Script local_198 [5];
  Script local_68;
  
  if (hex->_M_string_length == 0) {
    local_1c8._0_8_ = "cfdapi_transaction_base.cpp";
    local_1c8._8_4_ = kOpSuccess226;
    local_1b8._0_8_ = "AddSign";
    core::logger::log<std::__cxx11::string_const&>
              ((CfdSourceLocation *)local_1c8,kCfdLogLevelWarning,
               "Failed to AddSign. Invalid hex string. empty data. tx=[{}]",hex);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_1c8._0_8_ = local_1c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Invalid hex string. empty data.","");
    core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_1c8);
    __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((create_controller->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*create_controller->_M_invoker)(__return_storage_ptr__,(_Any_data *)create_controller,hex);
  local_228.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar5 = (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 == pSVar1) {
    if (is_witness) goto LAB_003b6a96;
  }
  else {
    bVar3 = 0;
    local_208 = sign_params;
    do {
      bVar2 = SignParameter::IsOpCode(pSVar5);
      if (bVar2) {
        SignParameter::GetOpCode((ScriptOperator *)local_1c8,pSVar5);
        bVar2 = core::ScriptOperator::IsPushOperator((ScriptOperator *)local_1c8);
        local_1c8._0_8_ = &PTR__ScriptOperator_00722da0;
        if ((ScriptElement *)local_1b8._0_8_ != (ScriptElement *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_);
        }
        bVar3 = bVar3 | bVar2;
      }
      SignParameter::ConvertToSignature((ByteData *)local_1c8,pSVar5);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&local_228,(ByteData *)local_1c8);
      if ((ScriptElement *)local_1c8._0_8_ != (ScriptElement *)0x0) {
        operator_delete((void *)local_1c8._0_8_);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
    if (is_witness) {
LAB_003b6a96:
      if (clear_stack) {
        ConfidentialTransactionController::RemoveWitnessStackAll(__return_storage_ptr__,txid,vout);
      }
      ConfidentialTransactionController::AddWitnessStack
                (__return_storage_ptr__,txid,vout,&local_228);
      goto LAB_003b6b5c;
    }
    if (bVar3 != 0) {
      core::Script::Script(&local_68);
      if (!clear_stack) {
        ConfidentialTransactionController::GetTxIn
                  ((ConfidentialTxInReference *)local_1c8,__return_storage_ptr__,txid,vout);
        core::Script::Script(&local_200,local_198);
        core::Script::operator=(&local_68,&local_200);
        core::Script::~Script(&local_200);
        core::ConfidentialTxInReference::~ConfidentialTxInReference
                  ((ConfidentialTxInReference *)local_1c8);
      }
      local_200._vptr_Script = (_func_int **)&PTR__ScriptBuilder_007219a8;
      local_200.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_200.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_200.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      core::Script::GetElementList
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 local_1c8,&local_68);
      if ((ScriptElement *)local_1c8._0_8_ !=
          (ScriptElement *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_)) {
        pSVar4 = (ScriptElement *)local_1c8._0_8_;
        do {
          core::ScriptBuilder::AppendElement((ScriptBuilder *)&local_200,pSVar4);
          pSVar4 = pSVar4 + 1;
        } while (pSVar4 != (ScriptElement *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_));
      }
      std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 local_1c8);
      pSVar5 = (local_208->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (local_208->
               super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pSVar5 != pSVar1) {
        do {
          bVar2 = SignParameter::IsOpCode(pSVar5);
          if (bVar2) {
            SignParameter::GetOpCode((ScriptOperator *)local_1c8,pSVar5);
            core::ScriptBuilder::AppendOperator
                      ((ScriptBuilder *)&local_200,(ScriptOperator *)local_1c8);
            local_1c8._0_8_ = &PTR__ScriptOperator_00722da0;
            pSVar4 = (ScriptElement *)local_1b8._0_8_;
            if ((ScriptElement *)local_1b8._0_8_ != (ScriptElement *)(local_1b8 + 0x10)) {
LAB_003b6a54:
              operator_delete(pSVar4);
            }
          }
          else {
            SignParameter::ConvertToSignature((ByteData *)local_1c8,pSVar5);
            core::ScriptBuilder::AppendData((ScriptBuilder *)&local_200,(ByteData *)local_1c8);
            pSVar4 = (ScriptElement *)local_1c8._0_8_;
            if ((ScriptElement *)local_1c8._0_8_ != (ScriptElement *)0x0) goto LAB_003b6a54;
          }
          pSVar5 = pSVar5 + 1;
        } while (pSVar5 != pSVar1);
      }
      core::ScriptBuilder::Build((Script *)local_1c8,(ScriptBuilder *)&local_200);
      ConfidentialTransactionController::SetUnlockingScript
                (__return_storage_ptr__,txid,vout,(Script *)local_1c8);
      core::Script::~Script((Script *)local_1c8);
      local_200._vptr_Script = (_func_int **)&PTR__ScriptBuilder_007219a8;
      if (local_200.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::Script::~Script(&local_68);
      goto LAB_003b6b5c;
    }
  }
  if (clear_stack) {
    ConfidentialTransactionController::SetUnlockingScript
              (__return_storage_ptr__,txid,vout,&local_228);
  }
  else {
    ConfidentialTransactionController::InsertUnlockingScript
              (__return_storage_ptr__,txid,vout,&local_228);
  }
LAB_003b6b5c:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_228);
  return __return_storage_ptr__;
}

Assistant:

T TransactionApiBase::AddSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) {
  if (hex.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddSign. Invalid hex string. empty data. tx=[{}]", hex);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  // TransactionController作成
  T txc = create_controller(hex);

  std::vector<ByteData> sign_stack;
  bool has_op_code = false;
  for (const SignParameter& sign_param : sign_params) {
    if (sign_param.IsOpCode()) {
      ScriptOperator op_code = sign_param.GetOpCode();
      if (op_code.IsPushOperator()) {
        has_op_code = true;
      }
    }
    sign_stack.push_back(sign_param.ConvertToSignature());
  }

  if (is_witness) {
    // Witnessの追加
    if (clear_stack) {
      txc.RemoveWitnessStackAll(txid, vout);
    }
    txc.AddWitnessStack(txid, vout, sign_stack);
  } else if (!has_op_code) {
    if (clear_stack) {
      txc.SetUnlockingScript(txid, vout, sign_stack);
    } else {
      txc.InsertUnlockingScript(txid, vout, sign_stack);
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = txc.GetTxIn(txid, vout).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    txc.SetUnlockingScript(txid, vout, builder.Build());
  }

  return txc;
}